

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

bool __thiscall FScanner::CheckFloat(FScanner *this)

{
  bool bVar1;
  char *in_RAX;
  double dVar2;
  char *stopper;
  char *local_18;
  
  local_18 = in_RAX;
  bVar1 = GetString(this);
  if (bVar1) {
    if (*this->String != '\0') {
      dVar2 = strtod(this->String,&local_18);
      this->Float = dVar2;
      if (*local_18 == '\0') {
        return true;
      }
    }
    this->AlreadyGot = true;
    this->AlreadyGotLine = this->LastGotLine;
  }
  return false;
}

Assistant:

bool FScanner::CheckFloat ()
{
	char *stopper;

	if (GetString())
	{
		if (String[0] == 0)
		{
			UnGet();
			return false;
		}
	
		Float = strtod (String, &stopper);
		if (*stopper != 0)
		{
			UnGet();
			return false;
		}
		return true;
	}
	else
	{
		return false;
	}
}